

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::InvarianceTest::iterate(InvarianceTest *this)

{
  ostringstream *poVar1;
  ShaderProgram *pSVar2;
  RenderContext *pRVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  RenderTarget *pRVar8;
  TextureFormat *pTVar9;
  long lVar10;
  char *pcVar11;
  void *data;
  char *pcVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  Surface resultSurface;
  Vec4 red;
  Vec4 color;
  Vec4 green;
  Surface local_210;
  int local_1f4;
  TextureFormat local_1f0;
  undefined8 uStack_1e8;
  long local_1e0;
  TextureFormat local_1d8;
  TextureFormat TStack_1d0;
  TextureFormat local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0 [384];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = pRVar8->m_depthBits;
  tcu::Surface::Surface(&local_210,this->m_renderSize,this->m_renderSize);
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x188))(0x4000);
  (**(code **)(lVar10 + 0x1a00))(0,0,this->m_renderSize);
  (**(code **)(lVar10 + 0x40))(0x8892,this->m_arrayBuf);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                  ,0x10c);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Testing position invariance.",0x1c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  poVar1 = (ostringstream *)(local_1b0 + 8);
  iVar14 = 0;
  local_1e0 = lVar10;
  iVar13 = 0;
  do {
    pSVar2 = (&this->m_shader0)[iVar14 != 0];
    uVar6 = (**(code **)(lVar10 + 0x780))((pSVar2->m_program).m_program,"a_input");
    uVar7 = (**(code **)(lVar10 + 0xb48))((pSVar2->m_program).m_program,"u_color");
    local_1f0.order = 0x3f800000;
    local_1f0.type = SNORM_INT8;
    uStack_1e8 = 0x3f80000000000000;
    local_1c0.order = R;
    local_1c0.type = 0x3f800000;
    uStack_1b8 = 0x3f80000000000000;
    pTVar9 = &local_1c0;
    if (iVar14 == 0) {
      pTVar9 = &local_1f0;
    }
    local_1d8 = *pTVar9;
    TStack_1d0 = pTVar9[1];
    pcVar11 = "green";
    if (iVar14 == 0) {
      pcVar11 = "red - purple";
    }
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Drawing position test pattern using shader ",0x2b);
    std::ostream::operator<<(poVar1,iVar13 + 1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Primitive color: ",0x13)
    ;
    lVar10 = 5;
    if (iVar14 == 0) {
      lVar10 = 0xc;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar11,lVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    lVar10 = local_1e0;
    (**(code **)(local_1e0 + 0x1680))((pSVar2->m_program).m_program);
    (**(code **)(lVar10 + 0x15a8))(uVar7,1,&local_1d8);
    (**(code **)(lVar10 + 0x610))(uVar6);
    (**(code **)(lVar10 + 0x19f0))(uVar6,4,0x1406,0,0x10,0);
    (**(code **)(lVar10 + 0x538))(4,0,this->m_verticesInPattern);
    (**(code **)(lVar10 + 0x518))(uVar6);
    dVar5 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar5,"draw pass",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                    ,0x123);
    bVar16 = iVar13 == 0;
    iVar14 = iVar14 + -1;
    iVar13 = iVar13 + 1;
  } while (bVar16);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1f0.order = RGBA;
  local_1f0.type = UNORM_INT8;
  data = (void *)local_210.m_pixels.m_cap;
  if ((void *)local_210.m_pixels.m_cap != (void *)0x0) {
    data = local_210.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1f0,local_210.m_width,local_210.m_height,1,data);
  glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_1b0);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Verifying output. Expecting only green or background colored pixels.",0x44);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  bVar16 = checkImage(this,&local_210);
  bVar16 = !bVar16;
  if (iVar4 == 0) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Depth buffer not available, skipping z-test.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  }
  else {
    (**(code **)(lVar10 + 0x1d0))(0x3f800000);
    (**(code **)(lVar10 + 0x188))(0x4100);
    (**(code **)(lVar10 + 0x5e0))(0xb71);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Testing position invariance with z-test. Enabling GL_DEPTH_TEST.",
               0x40);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    iVar13 = 0;
    iVar4 = 0;
    do {
      pSVar2 = (&this->m_shader0)[iVar13 != 0];
      uVar6 = (**(code **)(lVar10 + 0x780))((pSVar2->m_program).m_program,"a_input");
      uVar7 = (**(code **)(lVar10 + 0xb48))((pSVar2->m_program).m_program,"u_color");
      bVar15 = iVar13 == 0;
      local_1f0.order = 0x3f800000;
      local_1f0.type = SNORM_INT8;
      uStack_1e8 = 0x3f80000000000000;
      pTVar9 = &local_1c0;
      if (bVar15) {
        pTVar9 = &local_1f0;
      }
      local_1c0.order = R;
      local_1c0.type = 0x3f800000;
      uStack_1b8 = 0x3f80000000000000;
      pcVar11 = "GL_EQUAL";
      if (bVar15) {
        pcVar11 = "GL_ALWAYS";
      }
      local_1d8 = *pTVar9;
      TStack_1d0 = pTVar9[1];
      pcVar12 = "green";
      if (bVar15) {
        pcVar12 = "red - purple";
      }
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Drawing Z-test pattern using shader ",0x24);
      local_1f4 = iVar4 + 1;
      std::ostream::operator<<(poVar1,local_1f4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Primitive color: ",0x13);
      lVar10 = 5;
      if (iVar13 == 0) {
        lVar10 = 0xc;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar12,lVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". DepthFunc: ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,pcVar11,(ulong)(iVar13 == 0) + 8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      lVar10 = local_1e0;
      (**(code **)(local_1e0 + 0x1680))((pSVar2->m_program).m_program);
      (**(code **)(lVar10 + 0x15a8))(uVar7,1,&local_1d8);
      (**(code **)(lVar10 + 0x4a0))((uint)bVar15 * 5 + 0x202);
      (**(code **)(lVar10 + 0x610))(uVar6);
      (**(code **)(lVar10 + 0x19f0))(uVar6,4,0x1406,0,0x10,0);
      (**(code **)(lVar10 + 0x538))(4,this->m_verticesInPattern);
      (**(code **)(lVar10 + 0x518))(uVar6);
      dVar5 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar5,"draw pass",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                      ,0x150);
      bVar15 = iVar4 == 0;
      iVar13 = iVar13 + -1;
      iVar4 = local_1f4;
    } while (bVar15);
    pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_1f0.order = RGBA;
    local_1f0.type = UNORM_INT8;
    if ((void *)local_210.m_pixels.m_cap != (void *)0x0) {
      local_210.m_pixels.m_cap = (size_t)local_210.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,&local_1f0,local_210.m_width,local_210.m_height,1,
               (void *)local_210.m_pixels.m_cap);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_1b0);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Verifying output. Expecting only green or background colored pixels.",0x44);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    bVar15 = checkImage(this,&local_210);
    bVar16 = bVar16 || !bVar15;
  }
  pcVar11 = "Pass";
  if (bVar16 != false) {
    pcVar11 = "Detected variance between two invariant values";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar16,pcVar11);
  tcu::Surface::~Surface(&local_210);
  return STOP;
}

Assistant:

InvarianceTest::IterateResult InvarianceTest::iterate (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const bool				depthBufferExists	= m_context.getRenderTarget().getDepthBits() != 0;
	tcu::Surface			resultSurface		(m_renderSize, m_renderSize);
	bool					error				= false;

	// Prepare draw
	gl.clearColor		(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear			(GL_COLOR_BUFFER_BIT);
	gl.viewport			(0, 0, m_renderSize, m_renderSize);
	gl.bindBuffer		(GL_ARRAY_BUFFER, m_arrayBuf);
	GLU_EXPECT_NO_ERROR	(gl.getError(), "setup draw");

	m_testCtx.getLog() << tcu::TestLog::Message << "Testing position invariance." << tcu::TestLog::EndMessage;

	// Draw position check passes
	for (int passNdx = 0; passNdx < 2; ++passNdx)
	{
		const glu::ShaderProgram&	shader		= (passNdx == 0) ? (*m_shader0) : (*m_shader1);
		const glw::GLint			positionLoc = gl.getAttribLocation(shader.getProgram(), "a_input");
		const glw::GLint			colorLoc	= gl.getUniformLocation(shader.getProgram(), "u_color");
		const tcu::Vec4				red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
		const tcu::Vec4				green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
		const tcu::Vec4				color		= (passNdx == 0) ? (red) : (green);
		const char* const			colorStr	= (passNdx == 0) ? ("red - purple") : ("green");

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing position test pattern using shader " << (passNdx+1) << ". Primitive color: " << colorStr << "." << tcu::TestLog::EndMessage;

		gl.useProgram				(shader.getProgram());
		gl.uniform4fv				(colorLoc, 1, color.getPtr());
		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), DE_NULL);
		gl.drawArrays				(GL_TRIANGLES, 0, m_verticesInPattern);
		gl.disableVertexAttribArray	(positionLoc);
		GLU_EXPECT_NO_ERROR			(gl.getError(), "draw pass");
	}

	// Read result
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

	// Check there are no red pixels
	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output. Expecting only green or background colored pixels." << tcu::TestLog::EndMessage;
	error |= !checkImage(resultSurface);

	if (!depthBufferExists)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Depth buffer not available, skipping z-test." << tcu::TestLog::EndMessage;
	}
	else
	{
		// Test with Z-test
		gl.clearDepthf		(1.0f);
		gl.clear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.enable			(GL_DEPTH_TEST);

		m_testCtx.getLog() << tcu::TestLog::Message << "Testing position invariance with z-test. Enabling GL_DEPTH_TEST." << tcu::TestLog::EndMessage;

		// Draw position check passes
		for (int passNdx = 0; passNdx < 2; ++passNdx)
		{
			const glu::ShaderProgram&	shader			= (passNdx == 0) ? (*m_shader0) : (*m_shader1);
			const glw::GLint			positionLoc		= gl.getAttribLocation(shader.getProgram(), "a_input");
			const glw::GLint			colorLoc		= gl.getUniformLocation(shader.getProgram(), "u_color");
			const tcu::Vec4				red				= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
			const tcu::Vec4				green			= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
			const tcu::Vec4				color			= (passNdx == 0) ? (red) : (green);
			const glw::GLenum			depthFunc		= (passNdx == 0) ? (GL_ALWAYS) : (GL_EQUAL);
			const char* const			depthFuncStr	= (passNdx == 0) ? ("GL_ALWAYS") : ("GL_EQUAL");
			const char* const			colorStr		= (passNdx == 0) ? ("red - purple") : ("green");

			m_testCtx.getLog() << tcu::TestLog::Message << "Drawing Z-test pattern using shader " << (passNdx+1) << ". Primitive color: " << colorStr << ". DepthFunc: " << depthFuncStr << tcu::TestLog::EndMessage;

			gl.useProgram				(shader.getProgram());
			gl.uniform4fv				(colorLoc, 1, color.getPtr());
			gl.depthFunc				(depthFunc);
			gl.enableVertexAttribArray	(positionLoc);
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), DE_NULL);
			gl.drawArrays				(GL_TRIANGLES, m_verticesInPattern, m_verticesInPattern); // !< buffer contains 2 m_verticesInPattern-sized patterns
			gl.disableVertexAttribArray	(positionLoc);
			GLU_EXPECT_NO_ERROR			(gl.getError(), "draw pass");
		}

		// Read result
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

		// Check there are no red pixels
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output. Expecting only green or background colored pixels." << tcu::TestLog::EndMessage;
		error |= !checkImage(resultSurface);
	}

	// Report result
	if (error)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Detected variance between two invariant values");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}